

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

void __thiscall icu_63::DecimalFormat::setPadCharacter(DecimalFormat *this,UnicodeString *padChar)

{
  UBool UVar1;
  int32_t iVar2;
  UChar32 ch;
  DecimalFormatProperties *pDVar3;
  UnicodeString local_58;
  UnicodeString *local_18;
  UnicodeString *padChar_local;
  DecimalFormat *this_local;
  
  local_18 = padChar;
  padChar_local = (UnicodeString *)this;
  pDVar3 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                     ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                      this->fields);
  UVar1 = icu_63::UnicodeString::operator==(padChar,&pDVar3->padString);
  if (UVar1 == '\0') {
    iVar2 = icu_63::UnicodeString::length(local_18);
    if (iVar2 < 1) {
      pDVar3 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                         ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                          this->fields);
      icu_63::UnicodeString::setToBogus(&pDVar3->padString);
    }
    else {
      ch = icu_63::UnicodeString::char32At(local_18,0);
      icu_63::UnicodeString::UnicodeString(&local_58,ch);
      pDVar3 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                         ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                          this->fields);
      icu_63::UnicodeString::operator=(&pDVar3->padString,&local_58);
      icu_63::UnicodeString::~UnicodeString(&local_58);
    }
    touchNoError(this);
  }
  return;
}

Assistant:

void DecimalFormat::setPadCharacter(const UnicodeString& padChar) {
    if (padChar == fields->properties->padString) { return; }
    if (padChar.length() > 0) {
        fields->properties->padString = UnicodeString(padChar.char32At(0));
    } else {
        fields->properties->padString.setToBogus();
    }
    touchNoError();
}